

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_factory.cpp
# Opt level: O0

void __thiscall
cpp_db::driver_factory::register_driver
          (driver_factory *this,string *name,driver_creator_function *creator)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>
  local_68;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lg;
  driver_creator_function *creator_local;
  string *name_local;
  driver_factory *this_local;
  
  lg._M_device = (mutex_type *)creator;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->factory_mutex);
  std::
  make_pair<std::__cxx11::string_const&,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>&>
            (&local_68,name,creator);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>>>
  ::
  insert<std::pair<std::__cxx11::string,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>>
            ((unordered_map<std::__cxx11::string,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<cpp_db::driver_interface,std::default_delete<cpp_db::driver_interface>>()>>>>
              *)this,&local_68);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<cpp_db::driver_interface,_std::default_delete<cpp_db::driver_interface>_>_()>_>
  ::~pair(&local_68);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void driver_factory::register_driver(const std::string &name, driver_factory::driver_creator_function creator)
{
    std::lock_guard<std::mutex> lg(factory_mutex);
    drivers.insert(std::make_pair(name, creator));
}